

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void xadd_EbGb(PDISASM pMyDisasm)

{
  REGISTERTYPE *pRVar1;
  Int64 *pIVar2;
  UInt8 UVar3;
  UInt8 UVar4;
  UInt8 UVar5;
  UInt8 UVar6;
  UInt8 UVar7;
  UInt8 UVar8;
  UInt8 UVar9;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    failDecode(pMyDisasm);
    return;
  }
  if ((pMyDisasm->Prefix).LockPrefix == '\x04') {
    (pMyDisasm->Prefix).LockPrefix = '\x01';
  }
  (pMyDisasm->Instruction).Category = 0x10001;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"xadd",5);
  EbGb(pMyDisasm);
  if (((pMyDisasm->Prefix).LockPrefix == '\x01') && ((pMyDisasm->Operand1).OpType != 0x30000)) {
    (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
  }
  (pMyDisasm->Operand1).AccessMode = 3;
  (pMyDisasm->Operand2).AccessMode = 3;
  pRVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
  *(byte *)&pRVar1->type = (byte)pRVar1->type | 0x20;
  pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
  *(byte *)pIVar2 = (byte)*pIVar2 | 1;
  UVar3 = EFLAGS_TABLE[0x6e].SF_;
  UVar4 = EFLAGS_TABLE[0x6e].ZF_;
  UVar5 = EFLAGS_TABLE[0x6e].AF_;
  UVar6 = EFLAGS_TABLE[0x6e].PF_;
  UVar7 = EFLAGS_TABLE[0x6e].CF_;
  UVar8 = EFLAGS_TABLE[0x6e].TF_;
  UVar9 = EFLAGS_TABLE[0x6e].IF_;
  (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x6e].OF_;
  (pMyDisasm->Instruction).Flags.SF_ = UVar3;
  (pMyDisasm->Instruction).Flags.ZF_ = UVar4;
  (pMyDisasm->Instruction).Flags.AF_ = UVar5;
  (pMyDisasm->Instruction).Flags.PF_ = UVar6;
  (pMyDisasm->Instruction).Flags.CF_ = UVar7;
  (pMyDisasm->Instruction).Flags.TF_ = UVar8;
  (pMyDisasm->Instruction).Flags.IF_ = UVar9;
  UVar3 = EFLAGS_TABLE[0x6e].NT_;
  UVar4 = EFLAGS_TABLE[0x6e].RF_;
  UVar5 = EFLAGS_TABLE[0x6e].alignment;
  (pMyDisasm->Instruction).Flags.DF_ = EFLAGS_TABLE[0x6e].DF_;
  (pMyDisasm->Instruction).Flags.NT_ = UVar3;
  (pMyDisasm->Instruction).Flags.RF_ = UVar4;
  (pMyDisasm->Instruction).Flags.alignment = UVar5;
  return;
}

Assistant:

void __bea_callspec__ xadd_EbGb(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
    return;
  }
  if (pMyDisasm->Prefix.LockPrefix == InvalidPrefix) {
      pMyDisasm->Prefix.LockPrefix = InUsePrefix;
  }
  pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+DATA_TRANSFER;
  #ifndef BEA_LIGHT_DISASSEMBLY
     (void) strcpy (pMyDisasm->Instruction.Mnemonic, "xadd");
  #endif
  EbGb(pMyDisasm);
  if (pMyDisasm->Prefix.LockPrefix == InUsePrefix) {
    if (pMyDisasm->Operand1.OpType != MEMORY_TYPE) {
      GV.ERROR_OPCODE = UD_;
    }
  }
  pMyDisasm->Operand1.AccessMode = READ + WRITE;
  pMyDisasm->Operand2.AccessMode = READ + WRITE;
  FillFlags(pMyDisasm,110);
}